

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.h
# Opt level: O0

uchar __thiscall Bstrlib::CBString::character(CBString *this,int i)

{
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  int i_local;
  CBString *this_local;
  
  if ((uint)(this->super_tagbstring).slen <= (uint)i) {
    bstr__cppwrapper_exception.msg.field_2._12_4_ = i;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"CBString::character idx out of bounds",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return (this->super_tagbstring).data[i];
}

Assistant:

inline unsigned char character (int i) const {
		if (((unsigned) i) >= (unsigned) slen) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
			bstringThrow ("character idx out of bounds");
#else
			return '\0';
#endif
		}
		return data[i];
	}